

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

ACT_TYPE __thiscall despot::POMCPPrior::GetAction(POMCPPrior *this,State *state)

{
  int n;
  size_type sVar1;
  State *state_local;
  POMCPPrior *this_local;
  
  (*this->_vptr_POMCPPrior[9])(this,state);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->preferred_actions_);
  if (sVar1 == 0) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->legal_actions_);
    if (sVar1 == 0) {
      n = (*this->model_->_vptr_DSPOMDP[5])();
      this_local._4_4_ = Random::NextInt((Random *)&Random::RANDOM,n);
    }
    else {
      this_local._4_4_ = Random::NextElement<int>((Random *)&Random::RANDOM,&this->legal_actions_);
    }
  }
  else {
    this_local._4_4_ = Random::NextElement<int>((Random *)&Random::RANDOM,&this->preferred_actions_)
    ;
  }
  return this_local._4_4_;
}

Assistant:

ACT_TYPE POMCPPrior::GetAction(const State& state) {
	ComputePreference(state);

	if (preferred_actions_.size() != 0)
		return Random::RANDOM.NextElement(preferred_actions_);

	if (legal_actions_.size() != 0)
		return Random::RANDOM.NextElement(legal_actions_);

	return Random::RANDOM.NextInt(model_->NumActions());
}